

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::predictInverseSingle(IMLE *this,X *x)

{
  Scalar *pSVar1;
  Index IVar2;
  reference pFVar3;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  reference this_01;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_02;
  value_type *__x;
  long in_RDI;
  Scal SVar4;
  ReturnType RVar5;
  ZZ invVar;
  int j_1;
  Scal p_x;
  int j;
  ZZ sumInvRj;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffb78;
  IMLE *in_stack_fffffffffffffb80;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffffb88;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffb90;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffb98;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffba0;
  value_type_conflict __x_00;
  size_type in_stack_fffffffffffffba8;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffbb0;
  double *in_stack_fffffffffffffbd0;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffbd8;
  X *in_stack_fffffffffffffd18;
  LinearExpert *in_stack_fffffffffffffd20;
  int local_1a8;
  int local_60;
  allocator local_59;
  string local_58 [88];
  
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb78);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb90
             ,(Index)in_stack_fffffffffffffb88,(Index)in_stack_fffffffffffffb80);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *)0x2fe8c0);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)0x2fe8d6);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x2fe8ec);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb80,
             (Index)in_stack_fffffffffffffb78);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78);
  *pSVar1 = 0.0;
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)0x2fe94e);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffba0
             ,(Index)in_stack_fffffffffffffb98,(Index)in_stack_fffffffffffffb90);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb80,
             (Index)in_stack_fffffffffffffb78);
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb80
                    );
  if (IVar2 == *(int *)(in_RDI + 4)) {
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 200); local_60 = local_60 + 1) {
      std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
      operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  *)(in_RDI + 0xb0),(long)local_60);
      SVar4 = LinearExpert::queryX(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      pFVar3 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_60);
      LinearExpert::getPredZInvVar(&pFVar3->super_LinearExpert);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)in_stack_fffffffffffffb78);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)in_stack_fffffffffffffb90,(value_type *)in_stack_fffffffffffffb88);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x2febf9);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)(in_RDI + 0x2a8),(long)local_60);
      pFVar3 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_60);
      LinearExpert::getPredZ(&pFVar3->super_LinearExpert);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb80,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb78);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                 in_stack_fffffffffffffb80,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)in_stack_fffffffffffffb78);
      pFVar3 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_60);
      LinearExpert::getPredZ(&pFVar3->super_LinearExpert);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
      RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
              dot<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                        ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         in_stack_fffffffffffffb80,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                          *)in_stack_fffffffffffffb78);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78);
      *pSVar1 = RVar5;
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78);
      *pSVar1 = *pSVar1 + SVar4;
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)(in_RDI + 0x2a8),(long)local_60);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffffba0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffffb98);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,"IMLE::predict: query dimension does not match output dimension!!",&local_59
              );
    message(in_stack_fffffffffffffb80,(string *)in_stack_fffffffffffffb78);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb90
               ,(Index)in_stack_fffffffffffffb88);
  }
  __x_00 = (value_type_conflict)((ulong)in_stack_fffffffffffffba0 >> 0x20);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78);
  *(double *)(in_RDI + 0x1b8) = *pSVar1 + *(double *)(in_RDI + 0x108);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffb80,(Index)in_stack_fffffffffffffb78);
  if ((*pSVar1 != 0.0) || (NAN(*pSVar1))) {
    if ((*(double *)(in_RDI + 0x78) != 0.0) || (NAN(*(double *)(in_RDI + 0x78)))) {
      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                (in_stack_fffffffffffffb78);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
                 (EigenBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 in_stack_fffffffffffffb78);
      this_02 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(in_RDI + 0x310);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (this_02,(Index)in_stack_fffffffffffffb88);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_02,
                 in_stack_fffffffffffffb88);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,0>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb80,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>_>
                  *)in_stack_fffffffffffffb78);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)this_02,(value_type *)in_stack_fffffffffffffb88);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2ff3d3);
      __x = (value_type *)(in_RDI + 0x328);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)in_stack_fffffffffffffb78);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)this_02,__x);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x2ff441);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                 in_stack_fffffffffffffb80,in_RDI + 0x340);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)this_02,(value_type *)__x);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x2ff4b5);
      *(undefined4 *)(in_RDI + 0x358) = 1;
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2ff54a);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbb0,
                 in_stack_fffffffffffffba8,__x_00);
    }
    else {
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::reserve((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::reserve(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbb0,
                 in_stack_fffffffffffffba8);
      for (local_1a8 = 0; local_1a8 < *(int *)(in_RDI + 200); local_1a8 = local_1a8 + 1) {
        pFVar3 = std::
                 vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
                 operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             *)(in_RDI + 0xb0),(long)local_1a8);
        LinearExpert::getPredZ(&pFVar3->super_LinearExpert);
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)in_stack_fffffffffffffb90,(value_type *)in_stack_fffffffffffffb88);
        pFVar3 = std::
                 vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
                 operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             *)(in_RDI + 0xb0),(long)local_1a8);
        this_00 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                  LinearExpert::getPredZVar(&pFVar3->super_LinearExpert);
        pFVar3 = std::
                 vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
                 operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             *)(in_RDI + 0xb0),(long)local_1a8);
        LinearExpert::get_p_x(&pFVar3->super_LinearExpert);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*(this_00,(double *)pFVar3);
        this_01 = std::
                  vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                *)(in_RDI + 0xb0),(long)local_1a8);
        LinearExpert::get_p_x(&this_01->super_LinearExpert);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
        ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                     *)this_00,(double *)pFVar3);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb80,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)in_stack_fffffffffffffb78);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)in_stack_fffffffffffffb90,(value_type *)in_stack_fffffffffffffb88);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)0x2ff234);
        pFVar3 = std::
                 vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
                 operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             *)(in_RDI + 0xb0),(long)local_1a8);
        LinearExpert::get_p_x(&pFVar3->super_LinearExpert);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,
                   (value_type *)in_stack_fffffffffffffb88);
      }
      *(undefined4 *)(in_RDI + 0x358) = *(undefined4 *)(in_RDI + 200);
    }
  }
  else {
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)in_stack_fffffffffffffb90,(value_type *)in_stack_fffffffffffffb88);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::push_back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)in_stack_fffffffffffffb90,(value_type *)in_stack_fffffffffffffb88);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,
               (value_type *)in_stack_fffffffffffffb88);
    *(undefined4 *)(in_RDI + 0x358) = 1;
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x2ff586);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictInverseSingle(X const &x)
{
    // Aux variables
    ZZ sumInvRj = zeroZZ;
    sumInvRzj.setZero(d,1);

    // Clear predict data structure
    invPredictions.clear();
    invPredictionsVar.clear();
    invPredictionsWeight.clear();

    sum_p_x.resize(1);
    sum_p_x(0) = 0.0;
    iInvRj.clear(); iInvRj.reserve(M);
    invRzj.resize(d,M);
    zInvRzj.resize(M);

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( x.size() != D )
    {
        message("IMLE::predict: query dimension does not match output dimension!!");

        sum_p_x.setZero(1);
    }
    else
#endif
        for(int j = 0; j < M; j++)
        {
            Scal p_x = experts[j].queryX(x);

            // These are needed for multivalued inverse prediction
            iInvRj.push_back(experts[j].getPredZInvVar() * p_x );
            invRzj.col(j) = iInvRj[j] * experts[j].getPredZ();
            zInvRzj(j) = experts[j].getPredZ().dot( invRzj.col(j) );

            sum_p_x(0) += p_x;
            sumInvRj += iInvRj[j];
            sumInvRzj.col(0) += invRzj.col(j);
        }
    sumAll = sum_p_x(0) + pNoiseModelX;

    if(sum_p_x(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        invPredictions.push_back(zeroZ);
        invPredictionsVar.push_back( infinityZZ );
        invPredictionsWeight.push_back(0.0);

        nInvSolFound = 1;
        return;
    }
    else if( param.multiValuedSignificance == 0.0 )
    {
        invPredictions.reserve(M);
        invPredictionsVar.reserve(M);
        invPredictionsWeight.reserve(M);

        for(int j = 0; j < M; j++)
        {
            invPredictions.push_back( experts[j].getPredZ() );
            invPredictionsVar.push_back( experts[j].getPredZVar() *(experts[j].get_p_x() + pNoiseModelX) / experts[j].get_p_x() );
            invPredictionsWeight.push_back(experts[j].get_p_x() / sumAll);
        }

        nInvSolFound = M;
        return;
    }
    else
    {
        ZZ invVar = sumInvRj.inverse();

        invPredictions.push_back( invVar * sumInvRzj.col(0) );
        invPredictionsVar.push_back( invVar * sumAll );
        invPredictionsWeight.push_back(sum_p_x(0) / sumAll );
    }

    nInvSolFound = 1;
    sNearestInv.clear();
    sNearestInv.resize(M,0);
}